

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_json_parser.h
# Opt level: O0

int seek2eos(uint8_t **buffer,uint8_t *limit)

{
  int iVar1;
  uint8_t *limit_local;
  uint8_t **buffer_local;
  
  while( true ) {
    if (limit <= *buffer) {
      return 0;
    }
    iVar1 = seek2marker(buffer,limit);
    if ((iVar1 != 0) && (**buffer == '\"')) break;
    *buffer = *buffer + 2;
  }
  return 1;
}

Assistant:

static inline int seek2eos(uint8_t **buffer,
                           register const uint8_t *const limit) {
  while (*buffer < limit) {
    if (seek2marker(buffer, limit) && **buffer == '"')
      return 1;
    (*buffer) += 2; /* consume both the escape '\\' and the escape code. */
  }
  return 0;
}